

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

QString * __thiscall
QProcessEnvironmentPrivate::nameToString(QProcessEnvironmentPrivate *this,Key *name)

{
  long lVar1;
  QByteArray *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *sname;
  NameMapMutexLocker locker;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::fromLocal8Bit<void>(in_stack_ffffffffffffff90);
  NameMapMutexLocker::NameMapMutexLocker
            ((NameMapMutexLocker *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QHash<QString,_QByteArray>::operator[]
            ((QHash<QString,_QByteArray> *)this_00,in_stack_ffffffffffffff98);
  QByteArray::operator=(in_RDX,(QByteArray *)in_stack_ffffffffffffff88);
  NameMapMutexLocker::~NameMapMutexLocker((NameMapMutexLocker *)0x79397d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline QString nameToString(const Key &name) const
    {
        const QString sname = QString::fromLocal8Bit(name);
        {
            const NameMapMutexLocker locker(this);
            nameMap[sname] = name;
        }
        return sname;
    }